

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O2

Matrix * __thiscall
ProcessEstimator::getEstimate(Matrix *__return_storage_ptr__,ProcessEstimator *this,Property *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  StochasticProcess *pSVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  double local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  Physical p_1;
  Graph a;
  Unit unit;
  string local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  string local_970;
  string name;
  Unit local_850;
  Physical local_7e8;
  Physical local_750;
  Physical local_6b8;
  Physical local_620;
  Physical local_588;
  Physical local_4f0;
  Physical local_458;
  Physical local_3c0;
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar6 = (this->super_Estimator).nEstimate;
  uVar4 = (this->super_Estimator).nSamples;
  if (uVar4 == 0) {
    local_d60 = 1.0;
  }
  else {
    local_d60 = (double)uVar4;
  }
  if ((uVar6 & 0x40) != 0) {
    local_d60 = local_d60 * ((this->super_Estimator).estimatorTime)->dt;
  }
  uVar6 = uVar6 & *p;
  if ((uVar6 & 1) == 0) {
    if ((uVar6 & 4) == 0) {
      if ((uVar6 & 8) == 0) {
        if ((uVar6 & 2) == 0) {
          Matrix::Matrix(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        Graph::Graph(&a,this->nLength,(int)this->nDist);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p_1,"process density",(allocator<char> *)&unit);
        Matrix::setName(&a.super_Matrix,(string *)&p_1);
        std::__cxx11::string::~string((string *)&p_1);
        pSVar5 = (this->super_Estimator).pSource;
        if (pSVar5 != (StochasticProcess *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_d30,(string *)&(pSVar5->super_Parametric).parametricName);
          std::operator+(&local_d10,"density of ",&local_d30);
          std::operator+(&name,&local_d10," (");
          std::__cxx11::string::string
                    ((string *)&local_d50,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,
                         &name,&local_d50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,
                         ")");
          Matrix::setName(&a.super_Matrix,(string *)&p_1);
          std::__cxx11::string::~string((string *)&p_1);
          std::__cxx11::string::~string((string *)&unit);
          std::__cxx11::string::~string((string *)&local_d50);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_d10);
          std::__cxx11::string::~string((string *)&local_d30);
          Physical::Physical(&local_620,&((this->super_Estimator).pSource)->super_Physical);
          Matrix::setPhysical(&a.super_Matrix,&local_620);
          Physical::~Physical(&local_620);
          Physical::Physical(&local_6b8,&((this->super_Estimator).estimatorTime)->super_Physical);
          Matrix::setPhysical(&a.super_Matrix,0,&local_6b8);
          Physical::~Physical(&local_6b8);
          Physical::Physical(&local_750,&((this->super_Estimator).pSource)->super_Physical);
          Matrix::setPhysical(&a.super_Matrix,1,&local_750);
          Physical::~Physical(&local_750);
          Physical::Physical(&p_1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f0,"probability",(allocator<char> *)&unit);
          Physical::setDescription(&p_1,&local_9f0);
          std::__cxx11::string::~string((string *)&local_9f0);
          Physical::Physical(&local_7e8,&p_1);
          Matrix::setPhysical(&a.super_Matrix,2,&local_7e8);
          Physical::~Physical(&local_7e8);
          Physical::~Physical(&p_1);
        }
        for (uVar6 = 0; (ulong)uVar6 < this->nDist; uVar6 = uVar6 + 1) {
          for (uVar7 = 0; uVar7 < this->nLength; uVar7 = uVar7 + 1) {
            dVar1 = this->dDistScale;
            dVar2 = ((this->super_Estimator).estimatorTime)->dt;
            dVar3 = this->dDistOffset;
            Matrix::operator[]((Matrix *)&name,&a.super_Matrix,(int)uVar7);
            Matrix::operator[]((Matrix *)&unit,(Matrix *)&name,uVar6);
            Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,0);
            Matrix::operator=((Matrix *)&p_1,(double)(uVar7 & 0xffffffff) * dVar1 * dVar2 + dVar3);
            Matrix::~Matrix((Matrix *)&p_1);
            Matrix::~Matrix((Matrix *)&unit);
            Matrix::~Matrix((Matrix *)&name);
            dVar1 = this->aDist[uVar7][uVar6];
            Matrix::operator[]((Matrix *)&name,&a.super_Matrix,(int)uVar7);
            Matrix::operator[]((Matrix *)&unit,(Matrix *)&name,uVar6);
            Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,1);
            Matrix::operator=((Matrix *)&p_1,dVar1 / local_d60);
            Matrix::~Matrix((Matrix *)&p_1);
            Matrix::~Matrix((Matrix *)&unit);
            Matrix::~Matrix((Matrix *)&name);
          }
        }
        Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
      }
      else {
        Graph::Graph(&a,this->nLength);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p_1,"process variance",(allocator<char> *)&unit);
        Matrix::setName(&a.super_Matrix,(string *)&p_1);
        std::__cxx11::string::~string((string *)&p_1);
        pSVar5 = (this->super_Estimator).pSource;
        if (pSVar5 != (StochasticProcess *)0x0) {
          (*(pSVar5->super_Physical)._vptr_Physical[10])(&p_1,&pSVar5->super_Physical);
          Unit::getName_abi_cxx11_(&name,(Unit *)&p_1);
          Unit::~Unit((Unit *)&p_1);
          pSVar5 = (this->super_Estimator).pSource;
          (*(pSVar5->super_Physical)._vptr_Physical[10])(&unit,&pSVar5->super_Physical);
          std::__cxx11::string::string((string *)&local_970,(string *)&name);
          operator*(&local_850,&unit,&unit);
          Physical::Physical(&p_1,&local_970,&local_850);
          Unit::~Unit(&local_850);
          std::__cxx11::string::~string((string *)&local_970);
          std::__cxx11::string::string
                    ((string *)&local_9b0,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricName
                    );
          std::operator+(&local_990,"variance of ",&local_9b0);
          std::operator+(&local_d50,&local_990," (");
          std::__cxx11::string::string
                    ((string *)&local_9d0,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType
                    );
          std::operator+(&local_d30,&local_d50,&local_9d0);
          std::operator+(&local_d10,&local_d30,")");
          Matrix::setName(&a.super_Matrix,&local_d10);
          std::__cxx11::string::~string((string *)&local_d10);
          std::__cxx11::string::~string((string *)&local_d30);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::__cxx11::string::~string((string *)&local_d50);
          std::__cxx11::string::~string((string *)&local_990);
          std::__cxx11::string::~string((string *)&local_9b0);
          Physical::Physical(&local_458,&p_1);
          Matrix::setPhysical(&a.super_Matrix,&local_458);
          Physical::~Physical(&local_458);
          Physical::Physical(&local_4f0,&((this->super_Estimator).estimatorTime)->super_Physical);
          Matrix::setPhysical(&a.super_Matrix,0,&local_4f0);
          Physical::~Physical(&local_4f0);
          Physical::Physical(&local_588,&p_1);
          Matrix::setPhysical(&a.super_Matrix,1,&local_588);
          Physical::~Physical(&local_588);
          Physical::~Physical(&p_1);
          Unit::~Unit(&unit);
          std::__cxx11::string::~string((string *)&name);
        }
        for (uVar7 = 0; uVar7 < this->nLength; uVar7 = uVar7 + 1) {
          dVar1 = ((this->super_Estimator).estimatorTime)->dt;
          Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
          Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,0);
          Matrix::operator=((Matrix *)&p_1,(double)(uVar7 & 0xffffffff) * dVar1);
          Matrix::~Matrix((Matrix *)&p_1);
          Matrix::~Matrix((Matrix *)&unit);
          dVar1 = this->aTwo[uVar7];
          dVar2 = this->aOne[uVar7];
          Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
          Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,1);
          Matrix::operator=((Matrix *)&p_1,
                            dVar1 / local_d60 - ((dVar2 / local_d60) * dVar2) / local_d60);
          Matrix::~Matrix((Matrix *)&p_1);
          Matrix::~Matrix((Matrix *)&unit);
        }
        Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
      }
    }
    else {
      Graph::Graph(&a,this->nLength);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p_1,"process mean",(allocator<char> *)&unit);
      Matrix::setName(&a.super_Matrix,(string *)&p_1);
      std::__cxx11::string::~string((string *)&p_1);
      pSVar5 = (this->super_Estimator).pSource;
      if (pSVar5 != (StochasticProcess *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_d30,(string *)&(pSVar5->super_Parametric).parametricName);
        std::operator+(&local_d10,"mean of ",&local_d30);
        std::operator+(&name,&local_d10," (");
        std::__cxx11::string::string
                  ((string *)&local_d50,
                   (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,
                       &name,&local_d50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,
                       ")");
        Matrix::setName(&a.super_Matrix,(string *)&p_1);
        std::__cxx11::string::~string((string *)&p_1);
        std::__cxx11::string::~string((string *)&unit);
        std::__cxx11::string::~string((string *)&local_d50);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&local_d10);
        std::__cxx11::string::~string((string *)&local_d30);
        Physical::Physical(&local_290,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,&local_290);
        Physical::~Physical(&local_290);
        Physical::Physical(&local_328,&((this->super_Estimator).estimatorTime)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,0,&local_328);
        Physical::~Physical(&local_328);
        Physical::Physical(&local_3c0,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,1,&local_3c0);
        Physical::~Physical(&local_3c0);
      }
      for (uVar7 = 0; uVar7 < this->nLength; uVar7 = uVar7 + 1) {
        dVar1 = ((this->super_Estimator).estimatorTime)->dt;
        Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
        Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,0);
        Matrix::operator=((Matrix *)&p_1,(double)(uVar7 & 0xffffffff) * dVar1);
        Matrix::~Matrix((Matrix *)&p_1);
        Matrix::~Matrix((Matrix *)&unit);
        dVar1 = this->aOne[uVar7];
        Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
        Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,1);
        Matrix::operator=((Matrix *)&p_1,dVar1 / local_d60);
        Matrix::~Matrix((Matrix *)&p_1);
        Matrix::~Matrix((Matrix *)&unit);
      }
      Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
    }
  }
  else {
    Graph::Graph(&a,this->nLength);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p_1,"process sample",(allocator<char> *)&unit);
    Matrix::setName(&a.super_Matrix,(string *)&p_1);
    std::__cxx11::string::~string((string *)&p_1);
    pSVar5 = (this->super_Estimator).pSource;
    if (pSVar5 != (StochasticProcess *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_d30,(string *)&(pSVar5->super_Parametric).parametricName);
      std::operator+(&local_d10,"sample of ",&local_d30);
      std::operator+(&name,&local_d10," (");
      std::__cxx11::string::string
                ((string *)&local_d50,
                 (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,
                     &name,&local_d50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit,")")
      ;
      Matrix::setName(&a.super_Matrix,(string *)&p_1);
      std::__cxx11::string::~string((string *)&p_1);
      std::__cxx11::string::~string((string *)&unit);
      std::__cxx11::string::~string((string *)&local_d50);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&local_d10);
      std::__cxx11::string::~string((string *)&local_d30);
      Physical::Physical(&local_c8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,&local_c8);
      Physical::~Physical(&local_c8);
      Physical::Physical(&local_160,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,0,&local_160);
      Physical::~Physical(&local_160);
      Physical::Physical(&local_1f8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,1,&local_1f8);
      Physical::~Physical(&local_1f8);
    }
    for (uVar7 = 0; uVar7 < this->nLength; uVar7 = uVar7 + 1) {
      dVar1 = ((this->super_Estimator).estimatorTime)->dt;
      Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
      Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,0);
      Matrix::operator=((Matrix *)&p_1,(double)(uVar7 & 0xffffffff) * dVar1);
      Matrix::~Matrix((Matrix *)&p_1);
      Matrix::~Matrix((Matrix *)&unit);
      dVar1 = this->aSample[uVar7];
      Matrix::operator[]((Matrix *)&unit,&a.super_Matrix,(int)uVar7);
      Matrix::operator[]((Matrix *)&p_1,(Matrix *)&unit,1);
      Matrix::operator=((Matrix *)&p_1,dVar1);
      Matrix::~Matrix((Matrix *)&p_1);
      Matrix::~Matrix((Matrix *)&unit);
    }
    Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
  }
  Matrix::~Matrix(&a.super_Matrix);
  return __return_storage_ptr__;
}

Assistant:

Matrix ProcessEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF)
		samples *= estimatorTime->dt;
	
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nLength);
		a.setName("process sample");
		if( pSource ) {
			a.setName( "sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aSample[i];
		}
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Graph a(nLength);
		a.setName("process mean");
		if( pSource ) {
			a.setName( "mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nLength);
		a.setName("process variance");
		if( pSource ) {
			string name = ((Physical *)pSource)->getUnit().getName();
			Unit unit = ((Physical *)pSource)->getUnit();
			Physical p(name, unit*unit);
			a.setName( "variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(p);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, p);
		}
		for(uint i=0; i<nLength; i++) {
			a[i][0] = estimatorTime->dt * (double) i;
			a[i][1] = (aTwo[i]/samples - (aOne[i]/samples*aOne[i]/samples));
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		Graph a(nLength, nDist);
		a.setName("process density");
		if( pSource ) {
			a.setName( "density of " + pSource->getName() + " (" + pSource->getType() + ")" );
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
			Physical p;
			p.setDescription("probability");
			a.setPhysical(2, p );
		}
        for(uint j=0; j<nDist; j++)
			for( uint i=0; i<nLength; i++ ) {
			a[i][j][0] = (estimatorTime->dt * (double(i) * dDistScale) + dDistOffset);
				a[i][j][1] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}